

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetNavID(ImGuiID id,int nav_layer,ImGuiID focus_scope_id)

{
  ImGuiContext *pIVar1;
  ImGuiID in_EDX;
  uint in_ESI;
  ImGuiID in_EDI;
  ImGuiContext *g;
  bool local_19;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindow == (ImGuiWindow *)0x0) {
    __assert_fail("g.NavWindow",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1f44,"void ImGui::SetNavID(ImGuiID, int, ImGuiID)");
  }
  local_19 = 1 < in_ESI;
  if (local_19) {
    __assert_fail("nav_layer == 0 || nav_layer == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1f45,"void ImGui::SetNavID(ImGuiID, int, ImGuiID)");
  }
  GImGui->NavId = in_EDI;
  pIVar1->NavFocusScopeId = in_EDX;
  pIVar1->NavWindow->NavLastIds[(int)in_ESI] = in_EDI;
  return;
}

Assistant:

void ImGui::SetNavID(ImGuiID id, int nav_layer, ImGuiID focus_scope_id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindow);
    IM_ASSERT(nav_layer == 0 || nav_layer == 1);
    g.NavId = id;
    g.NavFocusScopeId = focus_scope_id;
    g.NavWindow->NavLastIds[nav_layer] = id;
}